

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O0

JSValue js_boolean_constructor(JSContext *ctx,JSValue new_target,int argc,JSValue *argv)

{
  JSValue val_00;
  JSValue obj_00;
  JSValue v;
  JSValue JVar1;
  JSValue ctor;
  int iVar2;
  int iVar3;
  undefined8 in_RDX;
  undefined8 in_RSI;
  JSValue JVar4;
  JSValue obj;
  JSValue val;
  undefined8 local_98;
  JSValueUnion in_stack_ffffffffffffff78;
  JSValueUnion ctx_00;
  int64_t in_stack_ffffffffffffff80;
  JSValueUnion JVar5;
  JSValueUnion JVar6;
  undefined4 local_38;
  int class_id;
  JSContext *in_stack_ffffffffffffffd0;
  undefined8 in_stack_ffffffffffffffd8;
  JSValueUnion JVar7;
  undefined4 in_stack_ffffffffffffffe0;
  undefined4 uStack_c;
  
  local_38 = (undefined4)in_RDX;
  class_id = (int)((ulong)in_RDX >> 0x20);
  JVar4.tag = in_stack_ffffffffffffff80;
  JVar4.u.float64 = in_stack_ffffffffffffff78.float64;
  iVar2 = JS_ToBool((JSContext *)local_98,JVar4);
  ctx_00.int32._1_3_ = 0;
  ctx_00.int32._0_1_ = iVar2 != 0;
  ctx_00._4_4_ = uStack_c;
  JVar5.float64 = 4.94065645841247e-324;
  v.tag._0_4_ = local_38;
  v.u = (JSValueUnion)in_RSI;
  v.tag._4_4_ = class_id;
  JVar6 = ctx_00;
  iVar3 = JS_IsUndefined(v);
  if (iVar3 == 0) {
    ctor.tag._0_4_ = in_stack_ffffffffffffffe0;
    ctor.u = (JSValueUnion)in_stack_ffffffffffffffd8;
    ctor.tag._4_4_ = iVar2;
    JVar4 = js_create_from_ctor(in_stack_ffffffffffffffd0,ctor,class_id);
    local_98 = JVar4.u;
    JVar7 = (JSValueUnion)JVar4.tag;
    iVar2 = JS_IsException(JVar4);
    if (iVar2 == 0) {
      obj_00.tag = (int64_t)JVar6.ptr;
      obj_00.u.ptr = JVar7.ptr;
      val_00.tag = (int64_t)local_98;
      val_00.u.float64 = JVar5.float64;
      JS_SetObjectData((JSContext *)ctx_00.ptr,obj_00,val_00);
    }
  }
  else {
    JVar7.float64 = 4.94065645841247e-324;
    local_98 = JVar6;
  }
  JVar1.tag = (int64_t)JVar7.ptr;
  JVar1.u.ptr = local_98;
  return JVar1;
}

Assistant:

static JSValue js_boolean_constructor(JSContext *ctx, JSValueConst new_target,
                                     int argc, JSValueConst *argv)
{
    JSValue val, obj;
    val = JS_NewBool(ctx, JS_ToBool(ctx, argv[0]));
    if (!JS_IsUndefined(new_target)) {
        obj = js_create_from_ctor(ctx, new_target, JS_CLASS_BOOLEAN);
        if (!JS_IsException(obj))
            JS_SetObjectData(ctx, obj, val);
        return obj;
    } else {
        return val;
    }
}